

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O0

word zzAdd3(word *c,word *a,size_t n,word *b,size_t m)

{
  word wVar1;
  word *in_RCX;
  ulong in_RDX;
  word *in_RSI;
  word *in_RDI;
  ulong in_R8;
  word local_8;
  
  if (in_R8 < in_RDX) {
    wwCopy(in_RDI + in_R8,in_RSI + in_R8,in_RDX - in_R8);
    wVar1 = zzAdd(in_RDI,in_RSI,in_RCX,in_R8);
    local_8 = zzAddW2(in_RDI + in_R8,in_RDX - in_R8,wVar1);
  }
  else if (in_RDX < in_R8) {
    wwCopy(in_RDI + in_RDX,in_RCX + in_RDX,in_R8 - in_RDX);
    wVar1 = zzAdd(in_RDI,in_RSI,in_RCX,in_RDX);
    local_8 = zzAddW2(in_RDI + in_RDX,in_R8 - in_RDX,wVar1);
  }
  else {
    local_8 = zzAdd(in_RDI,in_RSI,in_RCX,in_RDX);
  }
  return local_8;
}

Assistant:

word zzAdd3(word c[], const word a[], size_t n, const word b[], size_t m)
{
	if (n > m)
	{
		wwCopy(c + m, a + m, n - m);
		return zzAddW2(c + m, n - m, zzAdd(c, a, b, m));
	}
	if (n < m)
	{
		wwCopy(c + n, b + n, m - n);
		return zzAddW2(c + n, m - n, zzAdd(c, a, b, n));
	}
	return zzAdd(c, a, b, n);
}